

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

optional<long> __thiscall
anon_unknown.dwarf_e9e4d4::MultisigDescriptor::ScriptSize(MultisigDescriptor *this)

{
  pointer puVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined8 extraout_RDX;
  long lVar5;
  pointer puVar6;
  long in_FS_OFFSET;
  optional<long> oVar7;
  size_type n_keys;
  unsigned_long local_78;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_70;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  puVar6 = (this->super_DescriptorImpl).m_pubkey_args.
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->super_DescriptorImpl).m_pubkey_args.
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_78 = (long)puVar1 - (long)puVar6 >> 3;
  lVar5 = 0;
  for (; puVar6 != puVar1; puVar6 = puVar6 + 1) {
    iVar4 = (*((puVar6->_M_t).
               super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
               ._M_t.
               super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
               .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl)
              ->_vptr_PubkeyProvider[4])();
    lVar5 = lVar5 + CONCAT44(extraout_var,iVar4) + 1;
  }
  BuildScript<unsigned_long_const&>((CScript *)&local_50,&local_78);
  BuildScript<int_const&>((CScript *)&local_70,&this->m_threshold);
  uVar2 = local_50._size - 0x1d;
  if (local_50._size < 0x1d) {
    uVar2 = local_50._size;
  }
  uVar3 = local_70._size - 0x1d;
  if (local_70._size < 0x1d) {
    uVar3 = local_70._size;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_70);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    oVar7.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._9_7_
         = (undefined7)((ulong)extraout_RDX >> 8);
    oVar7.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_engaged = true;
    oVar7.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value = lVar5 + (ulong)(uVar2 + uVar3 + 1);
    return (optional<long>)
           oVar7.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<int64_t> ScriptSize() const override {
        const auto n_keys = m_pubkey_args.size();
        auto op = [](int64_t acc, const std::unique_ptr<PubkeyProvider>& pk) { return acc + 1 + pk->GetSize();};
        const auto pubkeys_size{std::accumulate(m_pubkey_args.begin(), m_pubkey_args.end(), int64_t{0}, op)};
        return 1 + BuildScript(n_keys).size() + BuildScript(m_threshold).size() + pubkeys_size;
    }